

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O0

void __thiscall Visualizer::generateDot(Visualizer *this,ASTNode *root)

{
  bool bVar1;
  int *piVar2;
  string *__rhs;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *pdVar3;
  string local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  reference local_f8;
  ASTNode **child;
  iterator __end1;
  iterator __begin1;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *__range1;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ASTNode *local_18;
  ASTNode *root_local;
  Visualizer *this_local;
  
  local_18 = root;
  root_local = (ASTNode *)this;
  piVar2 = AST::ASTNode::getUniqueID(root);
  std::__cxx11::to_string(&local_98,*piVar2);
  std::operator+(&local_78,&local_98," [label=\"");
  __rhs = AST::ASTNode::getName_abi_cxx11_(local_18);
  std::operator+(&local_58,&local_78,__rhs);
  std::operator+(&local_38,&local_58,"\"];\n");
  std::__cxx11::string::operator+=((string *)this,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  pdVar3 = AST::ASTNode::getChildren(local_18);
  bVar1 = std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::empty(pdVar3);
  if (!bVar1) {
    pdVar3 = AST::ASTNode::getChildren(local_18);
    std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::begin
              ((iterator *)&__end1._M_node,pdVar3);
    std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::end((iterator *)&child,pdVar3);
    while (bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&child), bVar1) {
      local_f8 = std::_Deque_iterator<AST::ASTNode_*,_AST::ASTNode_*&,_AST::ASTNode_**>::operator*
                           ((_Deque_iterator<AST::ASTNode_*,_AST::ASTNode_*&,_AST::ASTNode_**> *)
                            &__end1._M_node);
      piVar2 = AST::ASTNode::getUniqueID(local_18);
      std::__cxx11::to_string(&local_178,*piVar2);
      std::operator+(&local_158,&local_178," -> ");
      piVar2 = AST::ASTNode::getUniqueID(*local_f8);
      std::__cxx11::to_string(&local_198,*piVar2);
      std::operator+(&local_138,&local_158,&local_198);
      std::operator+(&local_118,&local_138,";\n");
      std::__cxx11::string::operator+=((string *)this,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
      generateDot(this,*local_f8);
      std::_Deque_iterator<AST::ASTNode_*,_AST::ASTNode_*&,_AST::ASTNode_**>::operator++
                ((_Deque_iterator<AST::ASTNode_*,_AST::ASTNode_*&,_AST::ASTNode_**> *)
                 &__end1._M_node);
    }
  }
  return;
}

Assistant:

void Visualizer::generateDot(AST::ASTNode *root) {
    dotFileContent += std::to_string(root->getUniqueID()) + " [label=\"" + root->getName() + "\"];\n";
    if (root->getChildren().empty()) return;
    for (const auto &child: root->getChildren()) {
        dotFileContent += std::to_string(root->getUniqueID()) + " -> " + std::to_string(child->getUniqueID()) + ";\n";
        generateDot(child);
    }
}